

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

APInt __thiscall llvm::detail::IEEEFloat::convertF80LongDoubleAPFloatToAPInt(IEEEFloat *this)

{
  bool bVar1;
  uint uVar2;
  integerPart *piVar3;
  undefined8 extraout_RDX;
  IEEEFloat *in_RSI;
  APInt AVar4;
  ArrayRef<unsigned_long> local_48;
  uint64_t local_38;
  uint64_t words [2];
  uint64_t mysignificand;
  uint64_t myexponent;
  IEEEFloat *this_local;
  
  if (in_RSI->semantics != (fltSemantics *)semX87DoubleExtended) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semX87DoubleExtended",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xaf0,"APInt llvm::detail::IEEEFloat::convertF80LongDoubleAPFloatToAPInt() const"
                 );
  }
  uVar2 = partCount(in_RSI);
  if (uVar2 == 2) {
    bVar1 = isFiniteNonZero(in_RSI);
    if (bVar1) {
      mysignificand = (uint64_t)(in_RSI->exponent + 0x3fff);
      piVar3 = significandParts(in_RSI);
      words[1] = *piVar3;
      if ((mysignificand == 1) && ((words[1] & 0x8000000000000000) == 0)) {
        mysignificand = 0;
      }
    }
    else if ((in_RSI->field_0x12 & 7) == 3) {
      mysignificand = 0;
      words[1] = 0;
    }
    else {
      if ((in_RSI->field_0x12 & 7) == 0) {
        words[1] = 0x8000000000000000;
      }
      else {
        if ((in_RSI->field_0x12 & 7) != 1) {
          __assert_fail("category == fcNaN && \"Unknown category\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xb01,
                        "APInt llvm::detail::IEEEFloat::convertF80LongDoubleAPFloatToAPInt() const")
          ;
        }
        piVar3 = significandParts(in_RSI);
        words[1] = *piVar3;
      }
      mysignificand = 0x7fff;
    }
    local_38 = words[1];
    words[0] = (long)(int)(uint)((byte)in_RSI->field_0x12 >> 3 & 1) << 0xf | mysignificand & 0x7fff;
    ArrayRef<unsigned_long>::ArrayRef<2ul>(&local_48,(unsigned_long (*) [2])&local_38);
    APInt::APInt((APInt *)this,0x50,local_48);
    AVar4._8_8_ = extraout_RDX;
    AVar4.U.pVal = (uint64_t *)this;
    return AVar4;
  }
  __assert_fail("partCount()==2",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xaf1,"APInt llvm::detail::IEEEFloat::convertF80LongDoubleAPFloatToAPInt() const");
}

Assistant:

APInt IEEEFloat::convertF80LongDoubleAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics*)&semX87DoubleExtended);
  assert(partCount()==2);

  uint64_t myexponent, mysignificand;

  if (isFiniteNonZero()) {
    myexponent = exponent+16383; //bias
    mysignificand = significandParts()[0];
    if (myexponent==1 && !(mysignificand & 0x8000000000000000ULL))
      myexponent = 0;   // denormal
  } else if (category==fcZero) {
    myexponent = 0;
    mysignificand = 0;
  } else if (category==fcInfinity) {
    myexponent = 0x7fff;
    mysignificand = 0x8000000000000000ULL;
  } else {
    assert(category == fcNaN && "Unknown category");
    myexponent = 0x7fff;
    mysignificand = significandParts()[0];
  }

  uint64_t words[2];
  words[0] = mysignificand;
  words[1] =  ((uint64_t)(sign & 1) << 15) |
              (myexponent & 0x7fffLL);
  return APInt(80, words);
}